

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O1

void __thiscall libtorrent::aux::utp_socket_impl::socket_drained(utp_socket_impl *this)

{
  error_code local_30;
  
  this->field_0x21d = this->field_0x21d & 0xdf;
  local_30.val_ = 0;
  local_30.failed_ = false;
  local_30.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  maybe_trigger_receive_callback(this,&local_30);
  local_30.val_ = 0;
  local_30.failed_ = false;
  local_30.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  maybe_trigger_send_callback(this,&local_30);
  return;
}

Assistant:

void utp_socket_impl::socket_drained()
{
	m_subscribe_drained = false;

	// at this point, we know we won't receive any
	// more packets this round. So, we may want to
	// call the receive callback function to
	// let the user consume it
	maybe_trigger_receive_callback({});
	maybe_trigger_send_callback({});
}